

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int rtreeFilter(sqlite3_vtab_cursor *pVtabCursor,int idxNum,char *idxStr,int argc,
               sqlite3_value **argv)

{
  char cVar1;
  uint uVar2;
  Rtree *pRtree;
  double dVar3;
  u64 n;
  int iVar4;
  i64 iRowid;
  RtreeSearchPoint *pRVar5;
  sqlite3_vtab *psVar6;
  uint *__src;
  undefined8 *puVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  RtreeNode *pRoot;
  int iCell;
  i64 iNode;
  RtreeNode *pLeaf;
  int local_7c;
  sqlite3_vtab_cursor local_70;
  int local_64;
  sqlite3_vtab_cursor *local_60;
  ulong local_58;
  sqlite3_value **local_50;
  char *local_48;
  sqlite3_int64 local_40;
  sqlite3_vtab_cursor local_38;
  
  pRtree = (Rtree *)pVtabCursor->pVtab;
  local_70.pVtab = (sqlite3_vtab *)0x0;
  local_64 = 0;
  pRtree->nBusy = pRtree->nBusy + 1;
  local_48 = idxStr;
  freeCursorConstraints((RtreeCursor *)pVtabCursor);
  sqlite3_free(pVtabCursor[6].pVtab);
  psVar6 = pVtabCursor[7].pVtab;
  memset(pVtabCursor + 1,0,0x120);
  pVtabCursor->pVtab = (sqlite3_vtab *)pRtree;
  pVtabCursor[7].pVtab = psVar6;
  *(int *)((long)&pVtabCursor[1].pVtab + 4) = idxNum;
  if (idxNum == 1) {
    iRowid = sqlite3VdbeIntValue(*argv);
    local_40 = 0;
    local_7c = findLeafNode(pRtree,iRowid,(RtreeNode **)&local_38,&local_40);
    if (local_38.pVtab == (sqlite3_vtab *)0x0 || local_7c != 0) {
      *(undefined1 *)&pVtabCursor[1].pVtab = 1;
    }
    else {
      pRVar5 = rtreeSearchPointNew((RtreeCursor *)pVtabCursor,0.0,'\0');
      pVtabCursor[0xb].pVtab = local_38.pVtab;
      pRVar5->id = local_40;
      pRVar5->eWithin = '\x01';
      local_7c = nodeRowidIndex(pRtree,(RtreeNode *)local_38.pVtab[1].pModule,iRowid,&local_64);
      pRVar5->iCell = (u8)local_64;
    }
    goto LAB_001dec6a;
  }
  local_7c = nodeAcquire(pRtree,1,(RtreeNode *)0x0,(RtreeNode **)&local_70);
  if (argc < 1 || local_7c != 0) {
    if (local_7c != 0) goto LAB_001dec6a;
  }
  else {
    iVar4 = sqlite3_initialize();
    if (iVar4 != 0) {
      pVtabCursor[3].pVtab = (sqlite3_vtab *)0x0;
      *(int *)&pVtabCursor[2].pVtab = argc;
      local_7c = 7;
      goto LAB_001dec6a;
    }
    local_58 = (ulong)(uint)argc;
    n = local_58 * 0x18;
    psVar6 = (sqlite3_vtab *)sqlite3Malloc(n);
    pVtabCursor[3].pVtab = psVar6;
    *(int *)&pVtabCursor[2].pVtab = argc;
    local_7c = 7;
    if (psVar6 == (sqlite3_vtab *)0x0) goto LAB_001dec6a;
    uVar10 = 0;
    local_50 = argv;
    memset(psVar6,0,n);
    local_60 = pVtabCursor + 0x10;
    memset(local_60,0,(long)pRtree->iDepth * 4 + 4);
    lVar9 = 0x10;
    do {
      psVar6 = pVtabCursor[3].pVtab;
      cVar1 = local_48[uVar10 * 2];
      *(int *)((long)psVar6 + lVar9 + -0xc) = (int)cVar1;
      *(int *)((long)psVar6 + lVar9 + -0x10) = local_48[uVar10 * 2 + 1] + -0x30;
      if (cVar1 < 0x46) {
        dVar3 = sqlite3VdbeRealValue(local_50[uVar10]);
        *(double *)((long)psVar6 + lVar9 + -8) = dVar3;
      }
      else {
        __src = (uint *)sqlite3_value_pointer(local_50[uVar10],"RtreeMatchArg");
        if (__src == (uint *)0x0) {
          local_7c = 1;
          goto LAB_001dec6a;
        }
        uVar2 = *__src;
        iVar4 = sqlite3_initialize();
        if ((iVar4 != 0) ||
           (puVar7 = (undefined8 *)sqlite3Malloc((ulong)uVar2 + 0x70), puVar7 == (undefined8 *)0x0))
        goto LAB_001dec6a;
        puVar7[0xc] = 0;
        puVar7[0xd] = 0;
        puVar7[10] = 0;
        puVar7[0xb] = 0;
        puVar7[8] = 0;
        puVar7[9] = 0;
        puVar7[6] = 0;
        puVar7[7] = 0;
        puVar7[4] = 0;
        puVar7[5] = 0;
        puVar7[2] = 0;
        puVar7[3] = 0;
        *puVar7 = 0;
        puVar7[1] = 0;
        memcpy(puVar7 + 0xe,__src,(ulong)*__src);
        lVar8 = puVar7[0xf];
        *puVar7 = puVar7[0x12];
        *(undefined4 *)(puVar7 + 1) = *(undefined4 *)(puVar7 + 0x13);
        puVar7[2] = puVar7 + 0x15;
        puVar7[0xd] = puVar7[0x14];
        if (lVar8 == 0) {
          *(undefined4 *)((long)psVar6 + lVar9 + -0xc) = 0x47;
          lVar8 = puVar7[0x10];
        }
        *(long *)((long)psVar6 + lVar9 + -8) = lVar8;
        *(undefined8 **)((long)&psVar6->pModule + lVar9) = puVar7;
        *(uint *)(puVar7 + 7) = (uint)pRtree->nDim2;
        puVar7[6] = local_60;
        *(int *)(puVar7 + 8) = pRtree->iDepth + 1;
      }
      uVar10 = uVar10 + 1;
      lVar9 = lVar9 + 0x18;
    } while (local_58 != uVar10);
  }
  pRVar5 = rtreeSearchPointNew((RtreeCursor *)pVtabCursor,0.0,(char)pRtree->iDepth + '\x01');
  if (pRVar5 == (RtreeSearchPoint *)0x0) {
    return 7;
  }
  pRVar5->id = 1;
  pRVar5->eWithin = '\x01';
  pRVar5->iCell = '\0';
  pVtabCursor[0xb].pVtab = local_70.pVtab;
  local_70.pVtab = (sqlite3_vtab *)0x0;
  local_7c = rtreeStepToLeaf((RtreeCursor *)pVtabCursor);
LAB_001dec6a:
  nodeRelease(pRtree,(RtreeNode *)local_70.pVtab);
  rtreeRelease(pRtree);
  return local_7c;
}

Assistant:

static int rtreeFilter(
  sqlite3_vtab_cursor *pVtabCursor, 
  int idxNum, const char *idxStr,
  int argc, sqlite3_value **argv
){
  Rtree *pRtree = (Rtree *)pVtabCursor->pVtab;
  RtreeCursor *pCsr = (RtreeCursor *)pVtabCursor;
  RtreeNode *pRoot = 0;
  int ii;
  int rc = SQLITE_OK;
  int iCell = 0;
  sqlite3_stmt *pStmt;

  rtreeReference(pRtree);

  /* Reset the cursor to the same state as rtreeOpen() leaves it in. */
  freeCursorConstraints(pCsr);
  sqlite3_free(pCsr->aPoint);
  pStmt = pCsr->pReadAux;
  memset(pCsr, 0, sizeof(RtreeCursor));
  pCsr->base.pVtab = (sqlite3_vtab*)pRtree;
  pCsr->pReadAux = pStmt;

  pCsr->iStrategy = idxNum;
  if( idxNum==1 ){
    /* Special case - lookup by rowid. */
    RtreeNode *pLeaf;        /* Leaf on which the required cell resides */
    RtreeSearchPoint *p;     /* Search point for the leaf */
    i64 iRowid = sqlite3_value_int64(argv[0]);
    i64 iNode = 0;
    rc = findLeafNode(pRtree, iRowid, &pLeaf, &iNode);
    if( rc==SQLITE_OK && pLeaf!=0 ){
      p = rtreeSearchPointNew(pCsr, RTREE_ZERO, 0);
      assert( p!=0 );  /* Always returns pCsr->sPoint */
      pCsr->aNode[0] = pLeaf;
      p->id = iNode;
      p->eWithin = PARTLY_WITHIN;
      rc = nodeRowidIndex(pRtree, pLeaf, iRowid, &iCell);
      p->iCell = (u8)iCell;
      RTREE_QUEUE_TRACE(pCsr, "PUSH-F1:");
    }else{
      pCsr->atEOF = 1;
    }
  }else{
    /* Normal case - r-tree scan. Set up the RtreeCursor.aConstraint array 
    ** with the configured constraints. 
    */
    rc = nodeAcquire(pRtree, 1, 0, &pRoot);
    if( rc==SQLITE_OK && argc>0 ){
      pCsr->aConstraint = sqlite3_malloc64(sizeof(RtreeConstraint)*argc);
      pCsr->nConstraint = argc;
      if( !pCsr->aConstraint ){
        rc = SQLITE_NOMEM;
      }else{
        memset(pCsr->aConstraint, 0, sizeof(RtreeConstraint)*argc);
        memset(pCsr->anQueue, 0, sizeof(u32)*(pRtree->iDepth + 1));
        assert( (idxStr==0 && argc==0)
                || (idxStr && (int)strlen(idxStr)==argc*2) );
        for(ii=0; ii<argc; ii++){
          RtreeConstraint *p = &pCsr->aConstraint[ii];
          p->op = idxStr[ii*2];
          p->iCoord = idxStr[ii*2+1]-'0';
          if( p->op>=RTREE_MATCH ){
            /* A MATCH operator. The right-hand-side must be a blob that
            ** can be cast into an RtreeMatchArg object. One created using
            ** an sqlite3_rtree_geometry_callback() SQL user function.
            */
            rc = deserializeGeometry(argv[ii], p);
            if( rc!=SQLITE_OK ){
              break;
            }
            p->pInfo->nCoord = pRtree->nDim2;
            p->pInfo->anQueue = pCsr->anQueue;
            p->pInfo->mxLevel = pRtree->iDepth + 1;
          }else{
#ifdef SQLITE_RTREE_INT_ONLY
            p->u.rValue = sqlite3_value_int64(argv[ii]);
#else
            p->u.rValue = sqlite3_value_double(argv[ii]);
#endif
          }
        }
      }
    }
    if( rc==SQLITE_OK ){
      RtreeSearchPoint *pNew;
      pNew = rtreeSearchPointNew(pCsr, RTREE_ZERO, (u8)(pRtree->iDepth+1));
      if( pNew==0 ) return SQLITE_NOMEM;
      pNew->id = 1;
      pNew->iCell = 0;
      pNew->eWithin = PARTLY_WITHIN;
      assert( pCsr->bPoint==1 );
      pCsr->aNode[0] = pRoot;
      pRoot = 0;
      RTREE_QUEUE_TRACE(pCsr, "PUSH-Fm:");
      rc = rtreeStepToLeaf(pCsr);
    }
  }

  nodeRelease(pRtree, pRoot);
  rtreeRelease(pRtree);
  return rc;
}